

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data_00;
  time_t *ptVar1;
  _Bool _Var2;
  curltime cVar3;
  undefined4 uStack_7c;
  resdata *reslv;
  Curl_easy *data;
  undefined1 local_60 [4];
  int pf;
  addrinfo hints;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  ptVar1 = (time_t *)(data_00->state).resolver;
  *waitp = 0;
  if (conn->ip_version == 1) {
    data._4_4_ = 2;
  }
  else if (conn->ip_version == 2) {
    data._4_4_ = 10;
  }
  else {
    data._4_4_ = 0;
  }
  hints.ai_next = (addrinfo *)waitp;
  if (data._4_4_ != 2) {
    _Var2 = Curl_ipv6works(conn);
    if (!_Var2) {
      data._4_4_ = 2;
    }
  }
  memset(local_60,0,0x30);
  pf = data._4_4_;
  hints.ai_flags = 2;
  if (conn->transport == TRNSPRT_TCP) {
    hints.ai_flags = 1;
  }
  cVar3 = Curl_now();
  *ptVar1 = cVar3.tv_sec;
  ptVar1[1] = CONCAT44(uStack_7c,cVar3.tv_usec);
  _Var2 = init_resolve_thread(conn,hostname,port,(addrinfo *)local_60);
  if (_Var2) {
    (hints.ai_next)->ai_flags = 1;
  }
  else {
    Curl_failf(data_00,"getaddrinfo() thread failed to start\n");
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                                const char *hostname,
                                                int port,
                                                int *waitp)
{
  struct addrinfo hints;
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works(conn))
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (conn->transport == TRNSPRT_TCP)?
    SOCK_STREAM : SOCK_DGRAM;

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}